

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

double fasttext::getArgGauss<double>
                 (double val,minstd_rand *rng,double startSigma,double endSigma,double t,bool linear
                 )

{
  double *pdVar1;
  byte in_SIL;
  double in_XMM0_Qa;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *__urng;
  result_type_conflict __y;
  undefined1 auVar2 [16];
  normal_distribution<double> *in_XMM1_Qa;
  undefined1 auVar3 [16];
  double in_XMM2_Qa;
  undefined1 auVar4 [16];
  double in_XMM3_Qa;
  double updateCoeff;
  double coeff;
  normal_distribution<double> normal;
  double stddev;
  double returnValue;
  result_type_conflict in_stack_ffffffffffffff78;
  normal_distribution<double> *in_stack_ffffffffffffff80;
  double local_58;
  double local_50;
  double local_48;
  undefined8 local_40;
  double local_38;
  byte local_29;
  double local_8;
  
  local_29 = in_SIL & 1;
  __urng = (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
           (((double)in_XMM1_Qa - in_XMM2_Qa) / 0.5);
  local_48 = 0.5;
  local_50 = in_XMM3_Qa - 0.25;
  local_58 = 0.0;
  local_8 = in_XMM0_Qa;
  pdVar1 = std::max<double>(&local_50,&local_58);
  pdVar1 = std::min<double>(&local_48,pdVar1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_XMM1_Qa;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pdVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = -(double)__urng;
  auVar2 = vfmadd213sd_fma(auVar2,auVar3,auVar4);
  local_40 = auVar2._0_8_;
  std::normal_distribution<double>::normal_distribution
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(result_type_conflict)in_XMM1_Qa);
  __y = std::normal_distribution<double>::operator()(in_XMM1_Qa,__urng);
  if ((local_29 & 1) == 0) {
    local_38 = pow(2.0,__y);
    local_38 = local_38 * local_8;
  }
  else {
    local_38 = __y + local_8;
  }
  return local_38;
}

Assistant:

T getArgGauss(
    T val,
    std::minstd_rand& rng,
    double startSigma,
    double endSigma,
    double t,
    bool linear) {
  T returnValue;
  const double stddev = startSigma -
      ((startSigma - endSigma) / 0.5) *
          std::min(0.5, std::max((t - 0.25), 0.0));

  std::normal_distribution<double> normal(0.0, stddev);

  const double coeff = normal(rng);
  double updateCoeff = 0.0;

  if (linear) {
    updateCoeff = coeff;
    returnValue = static_cast<T>(updateCoeff + val);
  } else {
    updateCoeff = std::pow(2.0, coeff);
    returnValue = static_cast<T>(updateCoeff * val);
  }

  return returnValue;
}